

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Mask.cpp
# Opt level: O2

istream * amrex::operator>>(istream *is,Mask *m)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  istream *this;
  Long LVar11;
  int iVar12;
  int k;
  long lVar13;
  int iVar14;
  int local_7c;
  ulong local_78;
  int ncomp;
  Box b;
  IntVect q;
  
  std::istream::ignore((long)is,100000);
  b.smallend.vect[0] = 1;
  b.smallend.vect[1] = 1;
  b.smallend.vect[2] = 1;
  b.bigend.vect[0] = 0;
  b.bigend.vect[1] = 0;
  b.bigend.vect[2] = 0;
  b.btype.itype = 0;
  this = operator>>(is,&b);
  std::istream::operator>>((istream *)this,&ncomp);
  std::istream::ignore((long)is,100000);
  BaseFab<int>::resize(&m->super_BaseFab<int>,&b,ncomp,(Arena *)0x0);
  local_78 = (ulong)b.smallend.vect._0_8_ >> 0x20;
  local_7c = b.smallend.vect[2];
  iVar8 = b.bigend.vect[0];
  iVar9 = b.bigend.vect[1];
  iVar10 = b.bigend.vect[2];
  q.vect[0] = 0;
  q.vect[1] = 0;
  q.vect[2] = 0;
  iVar14 = b.smallend.vect[0];
  while (local_7c <= iVar10) {
    iVar12 = (int)local_78;
    if (iVar10 == local_7c) {
      if ((iVar9 < iVar12) || (iVar9 == iVar12 && iVar8 < iVar14)) break;
    }
    operator>>(is,&q);
    for (lVar13 = 0; lVar13 < ncomp; lVar13 = lVar13 + 1) {
      iVar1 = (m->super_BaseFab<int>).domain.smallend.vect[0];
      iVar2 = (m->super_BaseFab<int>).domain.smallend.vect[1];
      iVar3 = (m->super_BaseFab<int>).domain.bigend.vect[0];
      iVar4 = (m->super_BaseFab<int>).domain.smallend.vect[2];
      iVar5 = (m->super_BaseFab<int>).domain.bigend.vect[1];
      piVar6 = (m->super_BaseFab<int>).dptr;
      LVar11 = Box::numPts(&(m->super_BaseFab<int>).domain);
      std::istream::operator>>
                ((istream *)is,
                 piVar6 + (long)(iVar14 - iVar1) +
                          (long)((((iVar5 - iVar2) + 1) * (local_7c - iVar4) + (iVar12 - iVar2)) *
                                ((iVar3 - iVar1) + 1)) + LVar11 * lVar13);
    }
    std::istream::ignore((long)is,100000);
    bVar7 = b.bigend.vect[0] <= iVar14;
    iVar14 = iVar14 + 1;
    if (bVar7) {
      local_78 = (ulong)(iVar12 + 1);
      iVar14 = b.smallend.vect[0];
      if (b.bigend.vect[1] <= iVar12) {
        local_78 = (ulong)b.smallend.vect._0_8_ >> 0x20;
        local_7c = local_7c + 1;
      }
    }
  }
  std::istream::ignore((long)is,100000);
  return is;
}

Assistant:

std::istream&
operator>> (std::istream& is,
            Mask&         m)
{
    is.ignore(BL_IGNORE_MAX,':');
    Box b;
    int ncomp;
    is >> b >> ncomp;
    is.ignore(BL_IGNORE_MAX, '\n');
    m.resize(b,ncomp);
    IntVect sm = b.smallEnd();
    IntVect bg = b.bigEnd();
    IntVect q;
    for (IntVect p = sm; p <= bg; b.next(p))
    {
        is >> q;
        BL_ASSERT( p == q);
        for( int k=0; k<ncomp; k++ ) is >> m(p,k);
        is.ignore(BL_IGNORE_MAX, '\n');
    }
    is.ignore(BL_IGNORE_MAX,'\n');
    BL_ASSERT(is.good());
    return is;
}